

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.c
# Opt level: O3

mi_page_t * mi_find_page(mi_heap_t *heap,size_t size,size_t huge_alignment)

{
  byte *pbVar1;
  ushort uVar2;
  ushort uVar3;
  mi_heap_t *pmVar4;
  bool bVar5;
  byte bVar6;
  size_t sVar7;
  mi_page_t *pmVar8;
  mi_tld_t *extraout_RDX;
  mi_tld_t *extraout_RDX_00;
  mi_tld_t *extraout_RDX_01;
  mi_tld_t *tld;
  mi_tld_t *extraout_RDX_02;
  mi_tld_t *extraout_RDX_03;
  ulong uVar9;
  mi_heap_t *pmVar10;
  mi_heap_t *heap_00;
  mi_page_t *pq;
  
  if ((size < 0x10001) && (huge_alignment == 0)) {
    sVar7 = _mi_bin(size);
    heap_00 = (mi_heap_t *)heap->pages[sVar7].first;
    tld = extraout_RDX;
    if (heap_00 != (mi_heap_t *)0x0) {
      size = 0;
      _mi_page_free_collect((mi_page_t *)heap_00,false);
      tld = extraout_RDX_00;
      if ((mi_block_t *)heap_00->thread_id != (mi_block_t *)0x0) {
LAB_0049fe63:
        pbVar1 = (byte *)((long)&heap_00->thread_delayed_free + 7);
        *pbVar1 = *pbVar1 & 1;
        return (mi_page_t *)heap_00;
      }
    }
    pq = (mi_page_t *)(heap->pages + sVar7);
    bVar6 = 1;
    do {
      if (*(mi_heap_t **)pq == (mi_heap_t *)0x0) {
        heap_00 = (mi_heap_t *)0x0;
        pmVar10 = (mi_heap_t *)0x0;
      }
      else {
        uVar9 = 0;
        pmVar10 = (mi_heap_t *)0x0;
        heap_00 = *(mi_heap_t **)pq;
        do {
          pmVar4 = *(mi_heap_t **)((long)(heap_00->random).input + 0x10);
          uVar9 = uVar9 + 1;
          size = 0;
          _mi_page_free_collect((mi_page_t *)heap_00,false);
          if (((mi_block_t *)heap_00->thread_id == (mi_block_t *)0x0) &&
             (*(uint16_t *)((long)&heap_00->thread_delayed_free + 4) <=
              *(uint16_t *)((long)&heap_00->thread_delayed_free + 2))) {
            size = (size_t)pq;
            mi_page_to_full((mi_page_t *)heap_00,(mi_page_queue_t *)pq);
            tld = extraout_RDX_02;
          }
          else {
            if (pmVar10 == (mi_heap_t *)0x0) {
              uVar9 = 0;
              tld = extraout_RDX_01;
              pmVar10 = heap_00;
            }
            else {
              uVar2 = (ushort)heap_00->cookie;
              tld = (mi_tld_t *)(ulong)uVar2;
              if ((ushort)pmVar10->cookie <= uVar2) {
                uVar3 = *(uint16_t *)((long)&heap_00->thread_delayed_free + 4);
                size = (size_t)((uint)uVar3 - (uint)uVar2);
                tld = (mi_tld_t *)(ulong)(uint)(uVar3 >> 3);
                if (((int)(uint)(uVar3 >> 3) < (int)((uint)uVar3 - (uint)uVar2)) &&
                   (uVar3 <= *(uint16_t *)((long)&heap_00->thread_delayed_free + 2))) {
                  pmVar10 = heap_00;
                }
              }
            }
            if (((mi_block_t *)heap_00->thread_id != (mi_block_t *)0x0) || (4 < uVar9))
            goto LAB_0049fdf0;
          }
          heap_00 = pmVar4;
        } while (pmVar4 != (mi_heap_t *)0x0);
        heap_00 = (mi_heap_t *)0x0;
      }
LAB_0049fdf0:
      if (pmVar10 != (mi_heap_t *)0x0) {
        heap_00 = pmVar10;
      }
      if (heap_00 != (mi_heap_t *)0x0) {
        if (heap_00->thread_id == 0) {
          mi_page_extend_free(heap_00,(mi_page_t *)size,tld);
        }
        if (*(mi_heap_t **)pq != heap_00) {
          mi_page_queue_remove((mi_page_queue_t *)pq,(mi_page_t *)heap_00);
          mi_page_queue_push(heap,(mi_page_queue_t *)pq,(mi_page_t *)heap_00);
        }
        goto LAB_0049fe63;
      }
      _mi_heap_collect_retired(heap,false);
      size = (size_t)pq;
      pmVar8 = mi_page_fresh_alloc(heap,(mi_page_queue_t *)pq,heap->pages[sVar7].block_size,0);
      bVar5 = (bool)(bVar6 & pmVar8 == (mi_page_t *)0x0);
      bVar6 = 0;
      tld = extraout_RDX_03;
    } while (bVar5);
  }
  else {
    if (size < 0xfffffffe0001) {
      pmVar8 = mi_large_huge_page_alloc(heap,size,huge_alignment);
      return pmVar8;
    }
    pmVar8 = (mi_page_t *)0x0;
    _mi_error_message(0x4b,"allocation request is too large (%zu bytes)\n",size);
  }
  return pmVar8;
}

Assistant:

static mi_page_t* mi_find_page(mi_heap_t* heap, size_t size, size_t huge_alignment) mi_attr_noexcept {
  // huge allocation?
  const size_t req_size = size - MI_PADDING_SIZE;  // correct for padding_size in case of an overflow on `size`
  if mi_unlikely(req_size > (MI_MEDIUM_OBJ_SIZE_MAX - MI_PADDING_SIZE) || huge_alignment > 0) {
    if mi_unlikely(req_size > MI_MAX_ALLOC_SIZE) {
      _mi_error_message(EOVERFLOW, "allocation request is too large (%zu bytes)\n", req_size);
      return NULL;
    }